

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream * QtPrivate::readArrayBasedContainer<QList<Qt::Key>>(QDataStream *s,QList<Qt::Key> *c)

{
  QDataStream QVar1;
  ulong uVar2;
  char cVar3;
  undefined1 *asize;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  undefined8 local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<Qt::Key>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize = (undefined1 *)(ulong)local_3c;
  if (asize == (undefined1 *)0xffffffff) {
    asize = (undefined1 *)0xffffffffffffffff;
  }
  else if ((local_3c == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,&local_48);
    asize = local_48;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<Qt::Key>::reserve(c,(qsizetype)asize);
    while (asize != (undefined1 *)0x0) {
      asize = asize + -1;
      uVar2 = (ulong)local_48 >> 0x20;
      local_48 = (undefined1 *)CONCAT44((int)uVar2,0xaaaaaaaa);
      QDataStream::operator>>(s,(int *)&local_48);
      if (s[0x13] != (QDataStream)0x0) {
        QList<Qt::Key>::clear(c);
        break;
      }
      QPodArrayOps<Qt::Key>::emplace<Qt::Key&>
                ((QPodArrayOps<Qt::Key> *)c,(c->d).size,(Key *)&local_48);
      QList<Qt::Key>::end(c);
    }
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}